

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha256.cpp
# Opt level: O2

void __thiscall CHMAC_SHA256::CHMAC_SHA256(CHMAC_SHA256 *this,uchar *key,size_t keylen)

{
  long lVar1;
  int n;
  CSHA256 *this_00;
  long lVar2;
  long in_FS_OFFSET;
  CSHA256 local_e0;
  uchar rkey [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->outer);
  CSHA256::CSHA256(&this->inner);
  if (keylen < 0x41) {
    __memcpy_chk(rkey,key,keylen,0x40);
    memset(rkey + keylen,0,0x40 - keylen);
  }
  else {
    CSHA256::CSHA256(&local_e0);
    this_00 = CSHA256::Write(&local_e0,key,keylen);
    CSHA256::Finalize(this_00,rkey);
    rkey[0x20] = '\0';
    rkey[0x21] = '\0';
    rkey[0x22] = '\0';
    rkey[0x23] = '\0';
    rkey[0x24] = '\0';
    rkey[0x25] = '\0';
    rkey[0x26] = '\0';
    rkey[0x27] = '\0';
    rkey[0x28] = '\0';
    rkey[0x29] = '\0';
    rkey[0x2a] = '\0';
    rkey[0x2b] = '\0';
    rkey[0x2c] = '\0';
    rkey[0x2d] = '\0';
    rkey[0x2e] = '\0';
    rkey[0x2f] = '\0';
    rkey[0x30] = '\0';
    rkey[0x31] = '\0';
    rkey[0x32] = '\0';
    rkey[0x33] = '\0';
    rkey[0x34] = '\0';
    rkey[0x35] = '\0';
    rkey[0x36] = '\0';
    rkey[0x37] = '\0';
    rkey[0x38] = '\0';
    rkey[0x39] = '\0';
    rkey[0x3a] = '\0';
    rkey[0x3b] = '\0';
    rkey[0x3c] = '\0';
    rkey[0x3d] = '\0';
    rkey[0x3e] = '\0';
    rkey[0x3f] = '\0';
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    rkey[lVar2] = rkey[lVar2] ^ 0x5c;
  }
  CSHA256::Write(&this->outer,rkey,0x40);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    rkey[lVar2] = rkey[lVar2] ^ 0x6a;
  }
  CSHA256::Write(&this->inner,rkey,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA256::CHMAC_SHA256(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[64];
    if (keylen <= 64) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 64 - keylen);
    } else {
        CSHA256().Write(key, keylen).Finalize(rkey);
        memset(rkey + 32, 0, 32);
    }

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 64);

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 64);
}